

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O1

void Vec_VecPush(Vec_Vec_t *p,int Level,void *Entry)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  if (p->nSize <= Level) {
    iVar1 = Level + 1;
    if (p->nCap <= Level) {
      if (p->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((long)iVar1 << 3);
      }
      else {
        ppvVar4 = (void **)realloc(p->pArray,(long)iVar1 << 3);
      }
      p->pArray = ppvVar4;
      p->nCap = iVar1;
    }
    iVar8 = p->nSize;
    lVar7 = (long)iVar8;
    if (iVar8 <= Level) {
      iVar8 = (Level - iVar8) + 1;
      do {
        puVar5 = (undefined8 *)malloc(0x10);
        *puVar5 = 0;
        puVar5[1] = 0;
        p->pArray[lVar7] = puVar5;
        lVar7 = lVar7 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    p->nSize = iVar1;
  }
  if ((Level < 0) || (p->nSize <= Level)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                  ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
  }
  puVar3 = (uint *)p->pArray[(uint)Level];
  uVar2 = *puVar3;
  if (puVar3[1] == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (*(void **)(puVar3 + 2) == (void *)0x0) {
        pvVar6 = malloc(0x80);
      }
      else {
        pvVar6 = realloc(*(void **)(puVar3 + 2),0x80);
      }
      *(void **)(puVar3 + 2) = pvVar6;
      uVar9 = 0x10;
    }
    else {
      uVar9 = uVar2 * 2;
      if ((int)uVar9 <= (int)uVar2) goto LAB_008f2c37;
      if (*(void **)(puVar3 + 2) == (void *)0x0) {
        pvVar6 = malloc((ulong)uVar2 << 4);
      }
      else {
        pvVar6 = realloc(*(void **)(puVar3 + 2),(ulong)uVar2 << 4);
      }
      *(void **)(puVar3 + 2) = pvVar6;
    }
    *puVar3 = uVar9;
  }
LAB_008f2c37:
  uVar2 = puVar3[1];
  puVar3[1] = uVar2 + 1;
  *(void **)(*(long *)(puVar3 + 2) + (long)(int)uVar2 * 8) = Entry;
  return;
}

Assistant:

static inline void Vec_VecPush( Vec_Vec_t * p, int Level, void * Entry )
{
    if ( p->nSize < Level + 1 )
    {
        int i;
        Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
        for ( i = p->nSize; i < Level + 1; i++ )
            p->pArray[i] = Vec_PtrAlloc( 0 );
        p->nSize = Level + 1;
    }
    Vec_PtrPush( Vec_VecEntry(p, Level), Entry );
}